

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.c
# Opt level: O3

void aom_fft_2d_gen(float *input,float *temp,float *output,int n,aom_fft_1d_func_t tform,
                   aom_fft_transpose_func_t transpose,aom_fft_unpack_func_t unpack,int vec_size)

{
  long lVar1;
  float *pfVar2;
  long lVar3;
  float *pfVar4;
  
  if (n < 1) {
    (*transpose)(output,temp,n);
  }
  else {
    lVar3 = (long)vec_size;
    lVar1 = 0;
    pfVar2 = output;
    do {
      (*tform)(input,pfVar2,n);
      lVar1 = lVar1 + lVar3;
      input = input + lVar3;
      pfVar2 = pfVar2 + lVar3;
    } while (lVar1 < (long)(ulong)(uint)n);
    (*transpose)(output,temp,n);
    if (0 < n) {
      lVar1 = 0;
      pfVar2 = temp;
      pfVar4 = output;
      do {
        (*tform)(pfVar2,pfVar4,n);
        lVar1 = lVar1 + lVar3;
        pfVar2 = pfVar2 + lVar3;
        pfVar4 = pfVar4 + lVar3;
      } while (lVar1 < (long)(ulong)(uint)n);
    }
  }
  (*transpose)(output,temp,n);
  (*unpack)(temp,output,n);
  return;
}

Assistant:

void aom_fft_2d_gen(const float *input, float *temp, float *output, int n,
                    aom_fft_1d_func_t tform, aom_fft_transpose_func_t transpose,
                    aom_fft_unpack_func_t unpack, int vec_size) {
  for (int x = 0; x < n; x += vec_size) {
    tform(input + x, output + x, n);
  }
  transpose(output, temp, n);

  for (int x = 0; x < n; x += vec_size) {
    tform(temp + x, output + x, n);
  }
  transpose(output, temp, n);

  unpack(temp, output, n);
}